

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O0

void __thiscall xray_re::xr_light_object::save_v12(xr_light_object *this,xr_ini_writer *w)

{
  xr_ini_writer *pxVar1;
  size_t sVar2;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  char *__buf_06;
  void *__buf_07;
  string local_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  string local_38 [32];
  xr_ini_writer *local_18;
  xr_ini_writer *w_local;
  xr_light_object *this_local;
  
  local_18 = w;
  w_local = (xr_ini_writer *)this;
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  pxVar1 = local_18;
  std::__cxx11::string::string(local_38,(string *)&this->m_animation);
  sVar2 = 0;
  xr_ini_writer::write(pxVar1,0x2e2c93,local_38,0);
  std::__cxx11::string::~string(local_38);
  xr_ini_writer::write(local_18,0x2e2ca1,__buf,sVar2);
  xr_ini_writer::write(local_18,0x2e2cae,__buf_00,sVar2);
  xr_ini_writer::write(local_18,0x2e2cbb,__buf_01,sVar2);
  xr_ini_writer::write(local_18,0x2e2cc8,__buf_02,sVar2);
  local_58._0_4_ = (this->m_color).r;
  local_58._4_4_ = (this->m_color).g;
  uStack_50._0_4_ = (this->m_color).b;
  uStack_50._4_4_ = (this->m_color).a;
  xr_ini_writer::write(local_18,0x2e3bb8,__buf_03,sVar2);
  xr_ini_writer::write(local_18,0x2e2cd3,__buf_04,sVar2);
  pxVar1 = local_18;
  std::__cxx11::string::string(local_78,(string *)&this->m_texture);
  sVar2 = 0;
  xr_ini_writer::write(pxVar1,0x2e2cd8,local_78,0);
  std::__cxx11::string::~string(local_78);
  xr_ini_writer::write(local_18,0x2e2ce7,(void *)(ulong)this->m_control,sVar2);
  xr_ini_writer::write(local_18,0x2e2cf5,(void *)(ulong)this->m_flags,sVar2);
  xr_ini_writer::write(local_18,0x2e2d01,__buf_05,sVar2);
  xr_ini_writer::write
            (local_18,0x2e38e3,(void *)(ulong)*(uint *)&(this->super_xr_custom_object).field_0x6c,
             sVar2);
  __buf_06 = "off";
  if (this->m_use_in_d3d != 0) {
    __buf_06 = "on";
  }
  sVar2 = 1;
  xr_ini_writer::write(local_18,0x2e2d07,__buf_06,1);
  xr_ini_writer::write(local_18,0x2e4e39,(void *)0x11,sVar2);
  xr_ini_writer::write(local_18,0x2e2d12,__buf_07,sVar2);
  return;
}

Assistant:

void xr_light_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("anim_ref_name", this->m_animation, false);

	w->write("attenuation0", this->m_attenuation_constant);
	w->write("attenuation1", this->m_attenuation_linear);
	w->write("attenuation2", this->m_attenuation_quadratic);
	w->write("brightness", this->m_brightness);
	w->write("color", this->m_color);
	w->write("cone", this->m_cone_angle);

	w->write("fallof_texture", this->m_texture, false);

	w->write("light_control", this->m_control);
	w->write("light_flags", this->m_flags);
	w->write("range", this->m_range);
	w->write("type", this->m_type);
	w->write("use_in_d3d", this->m_use_in_d3d ? "on" : "off");
	w->write("version", LIGHT_VERSION);
	w->write("virtual_size", 0.0f);
}